

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O2

void Dch_ManResimulateCex(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Vec_Ptr_t *vRoots;
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  abctime aVar4;
  int iVar5;
  int i;
  long lVar6;
  int iVar7;
  int nSize;
  int local_44;
  abctime local_40;
  Aig_Obj_t *local_38;
  
  local_40 = Abc_Clock();
  Dch_ManCollectTfoCands(p,pObj,pRepr);
  p->nConeThis = 0;
  Aig_ManIncrementTravId(p->pAigTotal);
  p->pAigTotal->pConst1->TravId = p->pAigTotal->nTravIds;
  Dch_ManResimulateSolved_rec(p,pObj);
  local_38 = pRepr;
  Dch_ManResimulateSolved_rec(p,pRepr);
  iVar5 = p->nConeThis;
  if (p->nConeThis < p->nConeMax) {
    iVar5 = p->nConeMax;
  }
  p->nConeMax = iVar5;
  for (iVar5 = 0; vRoots = p->vSimRoots, iVar5 < vRoots->nSize; iVar5 = iVar5 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vRoots,iVar5);
    Dch_ManResimulateOther_rec(p,pAVar2);
  }
  iVar5 = Dch_ClassesRefineConst1Group(p->ppClasses,vRoots,0);
  iVar7 = 0;
  for (i = 0; i < p->vSimClasses->nSize; i = i + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vSimClasses,i);
    ppAVar3 = Dch_ClassesReadClass(p->ppClasses,pAVar2,&local_44);
    for (lVar6 = 0; lVar6 < local_44; lVar6 = lVar6 + 1) {
      Dch_ManResimulateOther_rec(p,ppAVar3[lVar6]);
    }
    iVar1 = Dch_ClassesRefineOneClass(p->ppClasses,pAVar2,0);
    iVar7 = iVar7 + iVar1;
  }
  if (((ulong)local_38 & 1) == 0) {
    if ((*(uint *)&local_38->field_0x18 & 7) == 1) {
      if (iVar5 == 0) {
        __assert_fail("RetValue1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                      ,0xd0,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    else if (iVar7 == 0) {
      __assert_fail("RetValue2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                    ,0xd2,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    aVar4 = Abc_Clock();
    p->timeSimSat = p->timeSimSat + (aVar4 - local_40);
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
}

Assistant:

void Dch_ManResimulateCex( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // get the equivalence classes
    Dch_ManCollectTfoCands( p, pObj, pRepr );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine these nodes
    RetValue1 = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    // resimulate the cone of influence of the cand classes
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimClasses, pRoot, i )
    {
        ppClass = Dch_ClassesReadClass( p->ppClasses, pRoot, &nSize );
        for ( k = 0; k < nSize; k++ )
            Dch_ManResimulateOther_rec( p, ppClass[k] );
        // refine this class
        RetValue2 += Dch_ClassesRefineOneClass( p->ppClasses, pRoot, 0 );
    }
    // make sure refinement happened
    if ( Aig_ObjIsConst1(pRepr) )
        assert( RetValue1 );
    else
        assert( RetValue2 );
p->timeSimSat += Abc_Clock() - clk;
}